

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::setMatrices
          (FastText *this,shared_ptr<fasttext::DenseMatrix> *inputMatrix,
          shared_ptr<fasttext::DenseMatrix> *outputMatrix)

{
  DenseMatrix *pDVar1;
  int64_t iVar2;
  int64_t iVar3;
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  iVar2 = Matrix::size((this->input_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
  iVar3 = Matrix::size((this->output_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
  if (iVar2 == iVar3) {
    std::dynamic_pointer_cast<fasttext::Matrix,fasttext::DenseMatrix>
              ((shared_ptr<fasttext::DenseMatrix> *)&local_40);
    std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::dynamic_pointer_cast<fasttext::Matrix,fasttext::DenseMatrix>
              ((shared_ptr<fasttext::DenseMatrix> *)&local_40);
    std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    pDVar1 = (this->wordVectors_)._M_t.
             super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
             .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
    (this->wordVectors_)._M_t.
    super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>._M_t.
    super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>.
    super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl = (DenseMatrix *)0x0;
    if (pDVar1 != (DenseMatrix *)0x0) {
      (**(code **)((long)(pDVar1->super_Matrix)._vptr_Matrix + 8))();
    }
    iVar2 = Matrix::size((this->input_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
    ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dim =
         (int)iVar2;
    buildModel(this);
    return;
  }
  __assert_fail("input_->size(1) == output_->size(1)",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/fasttext.cc"
                ,0x4c,
                "void fasttext::FastText::setMatrices(const std::shared_ptr<DenseMatrix> &, const std::shared_ptr<DenseMatrix> &)"
               );
}

Assistant:

void FastText::setMatrices(
    const std::shared_ptr<DenseMatrix>& inputMatrix,
    const std::shared_ptr<DenseMatrix>& outputMatrix) {
  assert(input_->size(1) == output_->size(1));

  input_ = std::dynamic_pointer_cast<Matrix>(inputMatrix);
  output_ = std::dynamic_pointer_cast<Matrix>(outputMatrix);
  wordVectors_.reset();
  args_->dim = input_->size(1);

  buildModel();
}